

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O1

int __thiscall sjtu::TrainManager::init(TrainManager *this,EVP_PKEY_CTX *ctx)

{
  BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_> *pBVar1;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *pBVar2;
  FileManager<sjtu::TrainManager::stationNameType> *pFVar3;
  DynamicFileManager<sjtu::trainType> *pDVar4;
  _Alloc_hider _Var5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  ofstream outfile;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  long *local_2a0 [2];
  long local_290 [2];
  long *local_280 [2];
  long local_270 [2];
  long *local_260 [2];
  long local_250 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_240 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  long local_220;
  filebuf local_218 [240];
  ios_base local_128 [264];
  
  if ((int)ctx == 0) {
    pBVar1 = (BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_> *)
             operator_new(0x18);
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"StationBpTree.dat","");
    BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::BplusTree
              (pBVar1,&local_2e0,0x100);
    this->StationBpTree = pBVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    pBVar2 = (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *)
             operator_new(0x18);
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"TrainBpTree.dat","");
    BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::BplusTree
              (pBVar2,&local_300,0x100);
    this->TrainBpTree = pBVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
    pDVar4 = (DynamicFileManager<sjtu::trainType> *)operator_new(0x228);
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"TrainFile.dat","");
    DynamicFileManager<sjtu::trainType>::DynamicFileManager(pDVar4,&local_320,0x10);
    this->TrainFile = pDVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    pFVar3 = (FileManager<sjtu::TrainManager::stationNameType> *)operator_new(0x228);
    paVar6 = &local_2c0.field_2;
    local_2c0._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"StationFile.dat","");
    FileManager<sjtu::TrainManager::stationNameType>::FileManager(pFVar3,&local_2c0,0x20);
    this->StationFile = pFVar3;
    _Var5._M_p = local_2c0._M_dataplus._M_p;
  }
  else {
    pBVar1 = this->StationBpTree;
    local_260[0] = local_250;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"StationBpTree.dat","");
    BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::init
              (pBVar1,(EVP_PKEY_CTX *)local_260);
    if (local_260[0] != local_250) {
      operator_delete(local_260[0],local_250[0] + 1);
    }
    pBVar2 = this->TrainBpTree;
    local_280[0] = local_270;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"TrainBpTree.dat","");
    BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::init
              (pBVar2,(EVP_PKEY_CTX *)local_280);
    if (local_280[0] != local_270) {
      operator_delete(local_280[0],local_270[0] + 1);
    }
    pDVar4 = this->TrainFile;
    local_2a0[0] = local_290;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"TrainFile.dat","");
    (**(pDVar4->super_FileManager_Base<sjtu::trainType>)._vptr_FileManager_Base)
              (pDVar4,(string *)local_2a0,0x10,1);
    if (local_2a0[0] != local_290) {
      operator_delete(local_2a0[0],local_290[0] + 1);
    }
    pFVar3 = this->StationFile;
    paVar6 = &local_230;
    local_240[0] = paVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"StationFile.dat","");
    (**(pFVar3->super_FileManager_Base<sjtu::TrainManager::stationNameType>)._vptr_FileManager_Base)
              (pFVar3,(string *)local_240,0x20,1);
    _Var5._M_p = (pointer)local_240[0];
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5._M_p != paVar6) {
    operator_delete(_Var5._M_p,paVar6->_M_allocated_capacity + 1);
  }
  pDVar4 = this->TrainFile;
  if ((pDVar4->super_FileManager_Base<sjtu::trainType>).is_newfile == true) {
    std::ofstream::ofstream(&local_220,"Bitset.dat",_S_out|_S_bin);
    std::ofstream::close();
    local_220 = _VTT;
    *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = _tellp;
    std::filebuf::~filebuf(local_218);
    pDVar4 = (DynamicFileManager<sjtu::trainType> *)std::ios_base::~ios_base(local_128);
  }
  return (int)pDVar4;
}

Assistant:

void init(bool is_reset = false)
		{
			if (is_reset)
			{
				StationBpTree -> init("StationBpTree.dat" , StationBpTree_cache_size , true);
				TrainBpTree -> init("TrainBpTree.dat" , TrainBpTree_cache_size , true);
				TrainFile -> init("TrainFile.dat" , TrainFile_cache_size , true);
				StationFile -> init("StationFile.dat" , StationFile_cache_size , true);
			}
			else
			{
				StationBpTree = new BplusTree<StringHasher::hashType , unsigned int> ("StationBpTree.dat" , StationBpTree_cache_size);
				TrainBpTree = new BplusTree<StringHasher::hashType , locType> ("TrainBpTree.dat" , TrainBpTree_cache_size);
				TrainFile = new DynamicFileManager<trainType> ("TrainFile.dat" , TrainFile_cache_size);
				StationFile = new FileManager<stationNameType> ("StationFile.dat" , StationFile_cache_size);
			}
			if (TrainFile -> is_newfile)
			{
				std::ofstream outfile("Bitset.dat" , std::ios_base::out | std::ios_base::binary);
				outfile.close();
			}
		}